

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scrubbers.cpp
# Opt level: O2

string * ApprovalTests::Scrubbers::doNothing(string *__return_storage_ptr__,string *input)

{
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)input);
  return __return_storage_ptr__;
}

Assistant:

std::string doNothing(const std::string& input)
        {
            return input;
        }